

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_deleted_particles(bool write_p,bool write_ph)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  bool bVar4;
  _Ios_Openmode _Var5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong *puVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  pointer psVar11;
  reference pdVar12;
  ostream *poVar13;
  reference pvVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  byte in_SIL;
  byte in_DIL;
  ulong uVar16;
  double dVar17;
  int i_1;
  double spectrum_norm_ph;
  ofstream fout_spectrum_ph;
  int m_1;
  int j;
  iterator it;
  vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
  *del_particles;
  char s_cmr [20];
  int m;
  ofstream *fout_deleted_i;
  ofstream fout_deleted_ph;
  ofstream fout_deleted_p;
  ofstream fout_deleted_e;
  int n;
  int i_eps;
  int i;
  double *spectrum_ph;
  string file_name_suffix;
  string file_name;
  openmode non_binary_mode;
  vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
  *in_stack_fffffffffffff2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2f8;
  char *in_stack_fffffffffffff310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff318;
  OutputIterations *in_stack_fffffffffffff398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a40;
  int local_9e4;
  ostream local_9d8 [512];
  string local_7d8 [32];
  string local_7b8 [32];
  int local_798;
  int local_794;
  deleted_particle *local_790;
  __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
  local_788;
  vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
  *local_780;
  string local_778 [32];
  char local_758 [28];
  int local_73c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_738;
  ostream local_730 [512];
  string local_530 [32];
  string local_510 [32];
  ostream local_4f0 [512];
  string local_2f0 [32];
  string local_2d0 [32];
  ostream local_2b0 [512];
  string local_b0 [32];
  string local_90 [36];
  int local_6c;
  int local_68;
  int local_64;
  void *local_60;
  string local_48 [32];
  string local_28 [32];
  _Ios_Openmode local_8;
  byte local_2;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_2 = in_SIL & 1;
  if (mpi_rank == 0) {
    local_8 = _S_out;
  }
  else {
    local_8 = std::operator|(_S_out,_S_app);
  }
  std::__cxx11::string::string(local_28);
  OutputIterations::get_current_iteration_string_abi_cxx11_(in_stack_fffffffffffff398);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)neps_ph;
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_60 = operator_new__(uVar6);
  for (local_64 = 0; local_64 < neps_ph; local_64 = local_64 + 1) {
    *(undefined8 *)((long)local_60 + (long)local_64 * 8) = 0;
  }
  local_68 = 0;
  local_6c = 0;
  do {
    if (n_sr <= local_6c) {
      if ((local_2 & 1) != 0) {
        if (mpi_rank == 0) {
          MPI_Reduce(1,local_60,neps_ph,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
        }
        else {
          MPI_Reduce(local_60,local_60,neps_ph,&ompi_mpi_double,&ompi_mpi_op_sum,0,
                     &ompi_mpi_comm_world);
        }
        if (mpi_rank == 0) {
          std::operator+(in_stack_fffffffffffff318,in_stack_fffffffffffff310);
          std::operator+(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0);
          std::__cxx11::string::operator=(local_28,local_7b8);
          std::__cxx11::string::~string(local_7b8);
          std::__cxx11::string::~string(local_7d8);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          std::ofstream::ofstream(local_9d8,pcVar7,_S_out);
          dVar17 = ((lambda * 11148500000000.0 * dx * dy * dz) / 248.05021344239853) / deps_ph;
          for (local_9e4 = 0; local_9e4 < neps_ph; local_9e4 = local_9e4 + 1) {
            *(double *)((long)local_60 + (long)local_9e4 * 8) =
                 *(double *)((long)local_60 + (long)local_9e4 * 8) * dVar17;
            poVar13 = (ostream *)
                      std::ostream::operator<<
                                (local_9d8,*(double *)((long)local_60 + (long)local_9e4 * 8));
            std::operator<<(poVar13,'\n');
          }
          std::ofstream::close();
          std::ofstream::~ofstream(local_9d8);
        }
      }
      if (local_60 != (void *)0x0) {
        operator_delete__(local_60);
      }
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string(local_28);
      return;
    }
    if (mpi_rank == local_6c) {
      std::operator+(in_stack_fffffffffffff318,in_stack_fffffffffffff310);
      std::operator+(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0);
      std::__cxx11::string::operator=(local_28,local_90);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_2b0,pcVar7,local_8);
      std::operator+(in_stack_fffffffffffff318,in_stack_fffffffffffff310);
      std::operator+(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0);
      std::__cxx11::string::operator=(local_28,local_2d0);
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_2f0);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_4f0,pcVar7,local_8);
      std::operator+(in_stack_fffffffffffff318,in_stack_fffffffffffff310);
      std::operator+(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0);
      std::__cxx11::string::operator=(local_28,local_510);
      std::__cxx11::string::~string(local_510);
      std::__cxx11::string::~string(local_530);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(local_730,pcVar7,local_8);
      uVar6 = (ulong)n_ion_populations;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6;
      uVar8 = SUB168(auVar2 * ZEXT816(0x200),0);
      uVar16 = uVar8 + 8;
      if (0xfffffffffffffff7 < uVar8) {
        uVar16 = 0xffffffffffffffff;
      }
      if (SUB168(auVar2 * ZEXT816(0x200),8) != 0) {
        uVar16 = 0xffffffffffffffff;
      }
      puVar9 = (ulong *)operator_new__(uVar16);
      *puVar9 = uVar6;
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar9 + 1);
      if (uVar6 != 0) {
        local_a40 = pbVar10;
        do {
          std::ofstream::ofstream(local_a40);
          local_a40 = local_a40 + 0x200;
        } while (local_a40 != pbVar10 + uVar6 * 0x200);
      }
      local_738 = pbVar10;
      for (local_73c = 0; local_73c < n_ion_populations; local_73c = local_73c + 1) {
        sprintf(local_758,"%g",icmr[local_73c]);
        std::operator+(in_stack_fffffffffffff318,in_stack_fffffffffffff310);
        std::__cxx11::string::operator=(local_28,local_778);
        std::__cxx11::string::~string(local_778);
        std::__cxx11::string::operator+=(local_28,local_758);
        std::__cxx11::string::operator+=(local_28,"_");
        std::__cxx11::string::operator+=(local_28,local_48);
        pbVar10 = local_738 + (long)local_73c * 0x200;
        _Var5 = std::__cxx11::string::c_str();
        std::ofstream::open((char *)pbVar10,_Var5);
      }
      psVar11 = std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                          ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)
                           0x138ef7);
      local_780 = &psVar11->deleted_particles;
      local_788._M_current =
           (deleted_particle *)
           std::
           vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
           ::begin(in_stack_fffffffffffff2e8);
      while( true ) {
        local_790 = (deleted_particle *)
                    std::
                    vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
                    ::end(in_stack_fffffffffffff2e8);
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                            *)in_stack_fffffffffffff2f0,
                           (__normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                            *)in_stack_fffffffffffff2e8);
        if (!bVar4) break;
        pdVar12 = __gnu_cxx::
                  __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                  ::operator*(&local_788);
        if ((pdVar12->cmr != -1.0) || (NAN(pdVar12->cmr))) {
          if ((local_1 & 1) != 0) {
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            if ((pdVar12->cmr == 1.0) && (!NAN(pdVar12->cmr))) {
              i_particle_p = i_particle_p + 1;
              if (enthp_p < i_particle_p) {
                i_particle_ph = 0;
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(local_4f0,pdVar12->q);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                dVar3 = dx;
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                dVar17 = pdVar12->x;
                pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_6c);
                poVar13 = (ostream *)
                          std::ostream::operator<<
                                    (local_4f0,
                                     (dVar3 * (dVar17 + (double)*pvVar14)) / 6.283185307179586);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                dVar17 = dy;
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)
                          std::ostream::operator<<
                                    (local_4f0,(dVar17 * pdVar12->y) / 6.283185307179586);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                dVar17 = dz;
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)
                          std::ostream::operator<<
                                    (poVar13,(dVar17 * pdVar12->z) / 6.283185307179586);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(local_4f0,pdVar12->ux);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->uy);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->uz);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(local_4f0,pdVar12->g);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->chi);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
              }
              goto LAB_00139e29;
            }
          }
          if ((local_2 & 1) != 0) {
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            if ((pdVar12->cmr == 0.0) && (!NAN(pdVar12->cmr))) {
              pdVar12 = __gnu_cxx::
                        __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                        ::operator*(&local_788);
              local_68 = (int)((pdVar12->g * 0.511) / deps_ph);
              if ((-1 < local_68) && (local_68 < neps_ph)) {
                dVar17 = *(double *)((long)local_60 + (long)local_68 * 8);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                *(double *)((long)local_60 + (long)local_68 * 8) = dVar17 + pdVar12->q;
              }
              i_particle_ph = i_particle_ph + 1;
              if (enthp_ph < i_particle_ph) {
                i_particle_ph = 0;
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(local_730,pdVar12->q);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                dVar3 = dx;
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                dVar17 = pdVar12->x;
                pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_6c);
                poVar13 = (ostream *)
                          std::ostream::operator<<
                                    (local_730,
                                     (dVar3 * (dVar17 + (double)*pvVar14)) / 6.283185307179586);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                dVar17 = dy;
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)
                          std::ostream::operator<<
                                    (local_730,(dVar17 * pdVar12->y) / 6.283185307179586);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                dVar17 = dz;
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)
                          std::ostream::operator<<
                                    (poVar13,(dVar17 * pdVar12->z) / 6.283185307179586);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(local_730,pdVar12->ux);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->uy);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->uz);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(local_730,pdVar12->g);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->chi);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
              }
              goto LAB_00139e29;
            }
          }
          for (local_794 = 0; local_794 < n_ion_populations; local_794 = local_794 + 1) {
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            if ((pdVar12->cmr == icmr[local_794]) && (!NAN(pdVar12->cmr) && !NAN(icmr[local_794])))
            {
              i_particle_i = i_particle_i + 1;
              if (enthp_i < i_particle_i) {
                i_particle_i = 0;
                poVar13 = (ostream *)(local_738 + (long)local_794 * 0x200);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->q);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                dVar3 = dx;
                poVar13 = (ostream *)(local_738 + (long)local_794 * 0x200);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                dVar17 = pdVar12->x;
                pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_6c);
                poVar13 = (ostream *)
                          std::ostream::operator<<
                                    (poVar13,(dVar3 * (dVar17 + (double)*pvVar14)) /
                                             6.283185307179586);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                dVar17 = dy;
                poVar13 = (ostream *)(local_738 + (long)local_794 * 0x200);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)
                          std::ostream::operator<<
                                    (poVar13,(dVar17 * pdVar12->y) / 6.283185307179586);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                dVar17 = dz;
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)
                          std::ostream::operator<<
                                    (poVar13,(dVar17 * pdVar12->z) / 6.283185307179586);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                poVar13 = (ostream *)(local_738 + (long)local_794 * 0x200);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->ux);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->uy);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->uz);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                poVar13 = (ostream *)(local_738 + (long)local_794 * 0x200);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->g);
                poVar13 = (ostream *)
                          std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
                pdVar12 = __gnu_cxx::
                          __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                          ::operator*(&local_788);
                poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->chi);
                std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
              }
              break;
            }
          }
        }
        else {
          i_particle = i_particle + 1;
          if (enthp < i_particle) {
            i_particle = 0;
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            poVar13 = (ostream *)std::ostream::operator<<(local_2b0,pdVar12->q);
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            dVar3 = dx;
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            dVar17 = pdVar12->x;
            pvVar14 = std::vector<int,_std::allocator<int>_>::operator[](&x0_sr,(long)local_6c);
            poVar13 = (ostream *)
                      std::ostream::operator<<
                                (local_2b0,(dVar3 * (dVar17 + (double)*pvVar14)) / 6.283185307179586
                                );
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            dVar17 = dy;
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            poVar13 = (ostream *)
                      std::ostream::operator<<(local_2b0,(dVar17 * pdVar12->y) / 6.283185307179586);
            poVar13 = (ostream *)
                      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            dVar17 = dz;
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            poVar13 = (ostream *)
                      std::ostream::operator<<(poVar13,(dVar17 * pdVar12->z) / 6.283185307179586);
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            poVar13 = (ostream *)std::ostream::operator<<(local_2b0,pdVar12->ux);
            poVar13 = (ostream *)
                      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->uy);
            poVar13 = (ostream *)
                      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->uz);
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            poVar13 = (ostream *)std::ostream::operator<<(local_2b0,pdVar12->g);
            poVar13 = (ostream *)
                      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
            pdVar12 = __gnu_cxx::
                      __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
                      ::operator*(&local_788);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,pdVar12->chi);
            std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
          }
        }
LAB_00139e29:
        __gnu_cxx::
        __normal_iterator<spatial_region::deleted_particle_*,_std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>_>
        ::operator++(&local_788);
      }
      std::
      vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>::
      clear((vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
             *)0x139e4a);
      std::ofstream::close();
      std::ofstream::close();
      std::ofstream::close();
      for (local_798 = 0; pbVar10 = local_738, local_798 < n_ion_populations;
          local_798 = local_798 + 1) {
        std::ofstream::close();
      }
      if (local_738 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar15 = local_738 + -8;
        this = local_738 + *(ulong *)(local_738 + -8) * 0x200;
        while (pbVar10 != this) {
          this = this + -0x200;
          std::ofstream::~ofstream(this);
          in_stack_fffffffffffff318 = this;
        }
        operator_delete__(pbVar15);
      }
      std::ofstream::~ofstream(local_730);
      std::ofstream::~ofstream(local_4f0);
      std::ofstream::~ofstream(local_2b0);
    }
    MPI_Barrier(&ompi_mpi_comm_world);
    local_6c = local_6c + 1;
  } while( true );
}

Assistant:

void write_deleted_particles(bool write_p, bool write_ph)
{
    ios_base::openmode non_binary_mode;
    if (mpi_rank == 0) {
        non_binary_mode = ios_base::out;
    } else {
        non_binary_mode = ios_base::out | ios_base::app;
    }

    std::string file_name;
    std::string file_name_suffix = output_iterations.get_current_iteration_string();
    
    double* spectrum_ph = new double[neps_ph];
    for(int i=0; i<neps_ph; i++) spectrum_ph[i] = 0;
    int i_eps = 0;

    for(int n=0; n<n_sr; n++)
    {
        if (mpi_rank == n) {
            file_name = data_folder + "/deleted" + file_name_suffix;
            ofstream fout_deleted_e(file_name.c_str(), non_binary_mode);

            file_name = data_folder + "/deleted_p" + file_name_suffix;
            ofstream fout_deleted_p(file_name.c_str(), non_binary_mode);

            file_name = data_folder + "/deleted_ph" + file_name_suffix;
            ofstream fout_deleted_ph(file_name.c_str(), non_binary_mode);

            ofstream* fout_deleted_i = new ofstream[n_ion_populations];
            for (int m=0; m<n_ion_populations; ++m)
            {
                char s_cmr[20];
                sprintf(s_cmr,"%g",icmr[m]);
                file_name = data_folder+"/deleted_";
                file_name += s_cmr;
                file_name += "_";
                file_name += file_name_suffix;
                fout_deleted_i[m].open(file_name.c_str(), non_binary_mode);
            }

            vector<spatial_region::deleted_particle>& del_particles = psr->deleted_particles;

            for (auto it = del_particles.begin(); it != del_particles.end(); ++it)
            {
                if ((*it).cmr == -1)
                {
                    i_particle++;
                    if(i_particle > enthp)
                    {
                        i_particle = 0;
                        fout_deleted_e << (*it).q << endl;
                        fout_deleted_e << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_e << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_e << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_e << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_e << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else if (write_p && (*it).cmr == 1)
                {
                    i_particle_p++;
                    if(i_particle_p > enthp_p)
                    {
                        i_particle_ph = 0;
                        fout_deleted_p << (*it).q << endl;
                        fout_deleted_p << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_p << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_p << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_p << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_p << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else if (write_ph && (*it).cmr == 0)
                {
                    i_eps = (*it).g*0.511/deps_ph;
                    if((i_eps > -1) && (i_eps < neps_ph)) {
                        spectrum_ph[i_eps] = spectrum_ph[i_eps] + (*it).q; // q>0 for photons
                    }
                    i_particle_ph++;
                    if(i_particle_ph > enthp_ph)
                    {
                        i_particle_ph = 0;
                        fout_deleted_ph << (*it).q << endl;
                        fout_deleted_ph << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_ph << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_ph << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_ph << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_ph << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else
                {
                    for (int j=0; j<n_ion_populations; ++j)
                    {
                        if ((*it).cmr == icmr[j])
                        {
                            i_particle_i++;
                            if(i_particle_i > enthp_i)
                            {
                                i_particle_i = 0;
                                fout_deleted_i[j] << (*it).q << endl;
                                fout_deleted_i[j] << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                                fout_deleted_i[j] << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                                fout_deleted_i[j] << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                                #ifdef QUILL_NOQED
                                fout_deleted_i[j] << (*it).g << endl << 0.0 << endl;
                                #else
                                fout_deleted_i[j] << (*it).g << endl << (*it).chi << endl;
                                #endif
                            }
                            break;
                        }
                    }
                }
            }
            del_particles.clear();
            fout_deleted_e.close();
            fout_deleted_p.close();
            fout_deleted_ph.close();
            for (int m=0; m<n_ion_populations; ++m)
            {
                fout_deleted_i[m].close();
            }
            delete[] fout_deleted_i;
        }
        MPI_Barrier(MPI_COMM_WORLD);
    }

    if (write_ph) {
        //gathering photon spectra on process rank 0
        if (mpi_rank == 0) {
            MPI_Reduce(MPI_IN_PLACE, spectrum_ph, neps_ph, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
        } else {
            MPI_Reduce(spectrum_ph, spectrum_ph, neps_ph, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
        }

        //spectrum output
        if (mpi_rank == 0) {
            file_name = data_folder + "/spectrum_deleted_ph" + file_name_suffix;
            ofstream fout_spectrum_ph(file_name.c_str());

            double spectrum_norm_ph = 1.11485e13 * lambda*dx*dy*dz/(8*PI*PI*PI)/deps_ph;
            for(int i=0; i<neps_ph; i++)
            {
                spectrum_ph[i] = spectrum_ph[i] * spectrum_norm_ph;
                fout_spectrum_ph << spectrum_ph[i] << '\n';
            }

            fout_spectrum_ph.close();
        }
    }

    delete[] spectrum_ph;
}